

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O0

void __thiscall
draco::SequentialAttributeDecodersController::SequentialAttributeDecodersController
          (SequentialAttributeDecodersController *this,
          unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
          *sequencer)

{
  AttributesDecoder *in_RDI;
  unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
  *in_stack_ffffffffffffffd8;
  
  AttributesDecoder::AttributesDecoder(in_RDI);
  (in_RDI->super_AttributesDecoderInterface)._vptr_AttributesDecoderInterface =
       (_func_int **)&PTR__SequentialAttributeDecodersController_0032a058;
  std::
  vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
  ::vector((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
            *)0x207dbe);
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::vector((vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
            *)0x207dcc);
  std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::unique_ptr
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

SequentialAttributeDecodersController::SequentialAttributeDecodersController(
    std::unique_ptr<PointsSequencer> sequencer)
    : sequencer_(std::move(sequencer)) {}